

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateLayoutTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_830c8::StateLayoutTest::update
          (StateLayoutTest *this,ms_t param_1,ivec2 windowSize)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  char *name;
  _func_bool_void_ptr_int_char_ptr_ptr *items_getter;
  size_type sVar2;
  _lambda_void__int_char_const____1_ local_79;
  anon_class_1_0_00000001 selector;
  ImVec2 local_70;
  ImVec2 local_68;
  reference local_60;
  NamedElement **elem;
  iterator __end2;
  iterator __begin2;
  span<const_GUILayout::NamedElement_*const,_18446744073709551615UL> *__range2;
  pointer cur;
  StateLayoutTest *this_local;
  ivec2 windowSize_local;
  ms_t param_1_local;
  
  this_00 = std::
            vector<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
            ::operator[](&this->m_layouts,(long)this->m_curLayoutIndex);
  this_01 = std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>::get(this_00);
  GUILayout::update(this_01,windowSize);
  ___begin2 = GUILayout::namedElements(this_01);
  __end2 = std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>::begin
                     ((span<const_GUILayout::NamedElement_*const,_18446744073709551615UL> *)
                      &__begin2);
  elem = (NamedElement **)
         std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>::end
                   ((span<const_GUILayout::NamedElement_*const,_18446744073709551615UL> *)&__begin2)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_GUILayout::NamedElement_*const_*,_std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_GUILayout::NamedElement_*const_*,_std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_GUILayout::NamedElement_*const_*,_std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>_>
               ::operator*(&__end2);
    ImVec2::ImVec2(&local_68,(float)((*local_60)->topLeft).x,(float)((*local_60)->topLeft).y);
    ImVec2::ImVec2(&local_70,0.0,0.0);
    ImGui::SetNextWindowPos(&local_68,0,&local_70);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,(float)((*local_60)->size).x,
                   (float)((*local_60)->size).y);
    ImGui::SetNextWindowSize((ImVec2 *)&stack0xffffffffffffff88,0);
    name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&(*local_60)->name);
    ImGui::Begin(name,(bool *)0x0,0);
    ImGui::End();
    __gnu_cxx::
    __normal_iterator<const_GUILayout::NamedElement_*const_*,_std::span<const_GUILayout::NamedElement_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  ImGui::Begin("Selector",(bool *)0x0,0);
  local_79 = (_lambda_void__int_char_const____1_)0x0;
  items_getter = (anonymous_namespace)::StateLayoutTest::
                 update(std::chrono::duration,yama::vector2_t)::{lambda(void*,int,char_const**)#1}::
                 operator_cast_to_function_pointer(&local_79);
  sVar2 = std::
          vector<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
          ::size(&this->m_layouts);
  ImGui::ListBox("Layouts",&this->m_curLayoutIndex,items_getter,&this->m_layouts,(int)sVar2,10);
  ImGui::End();
  return;
}

Assistant:

virtual void update(ms_t, ivec2 windowSize) override
    {
        auto cur = m_layouts[m_curLayoutIndex].get();
        cur->update(windowSize);
        for (auto& elem : cur->namedElements())
        {
            ImGui::SetNextWindowPos({float(elem->topLeft.x), float(elem->topLeft.y)});
            ImGui::SetNextWindowSize({float(elem->size.x), float(elem->size.y)});
            ImGui::Begin(elem->name.c_str());
            ImGui::End();
        }

        ImGui::Begin("Selector");
        auto selector = [](void* pdata, int index, const char** out) {
            auto& data = *static_cast<std::vector<std::unique_ptr<GUILayout>>*>(pdata);
            *out = data[index]->name();
            return true;
        };
        ImGui::ListBox("Layouts", &m_curLayoutIndex, selector, &m_layouts, int(m_layouts.size()), 10);
        ImGui::End();
    }